

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngrutil.c
# Opt level: O1

int png_decompress_chunk
              (png_structrp png_ptr,png_uint_32 chunklength,png_uint_32 prefix_size,
              png_alloc_size_t *newlength,int terminate)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  png_bytep ppVar5;
  png_uint_32 lzsize;
  png_alloc_size_t *in_stack_ffffffffffffffa8;
  int local_4c;
  png_bytep local_48;
  size_t local_40;
  png_alloc_size_t local_38;
  
  uVar3 = 0xffffffffffffffff;
  if (1 < png_ptr->user_chunk_malloc_max + 1) {
    uVar3 = png_ptr->user_chunk_malloc_max;
  }
  uVar4 = uVar3 - (prefix_size + 1);
  if (uVar3 < prefix_size + 1) {
    png_zstream_error(png_ptr,-4);
    iVar2 = -4;
  }
  else {
    if (uVar4 < *newlength) {
      *newlength = uVar4;
    }
    iVar1 = png_inflate_claim(png_ptr,png_ptr->chunk_name);
    if (iVar1 == 0) {
      uVar3 = (ulong)prefix_size;
      local_4c = chunklength - prefix_size;
      iVar2 = png_inflate(png_ptr,png_ptr->chunk_name,(int)png_ptr->read_buffer + prefix_size,
                          (png_const_bytep)&local_4c,(png_uint_32p)0x0,(png_bytep)newlength,
                          in_stack_ffffffffffffffa8);
      if (iVar2 == 1) {
        iVar1 = inflateReset(&png_ptr->zstream);
        if (iVar1 == 0) {
          local_38 = *newlength;
          local_40 = uVar3 + local_38 + 1;
          ppVar5 = (png_bytep)png_malloc_base(png_ptr,local_40);
          if (ppVar5 == (png_bytep)0x0) {
            iVar2 = -4;
            png_zstream_error(png_ptr,-4);
          }
          else {
            memset(ppVar5,0,local_40);
            local_48 = ppVar5;
            iVar2 = png_inflate(png_ptr,png_ptr->chunk_name,(int)png_ptr->read_buffer + prefix_size,
                                (png_const_bytep)&local_4c,(png_uint_32p)(ppVar5 + uVar3),
                                (png_bytep)newlength,in_stack_ffffffffffffffa8);
            ppVar5 = local_48;
            if (iVar2 == 1) {
              iVar2 = -7;
              if (local_38 == *newlength) {
                local_48[uVar3 + *newlength] = '\0';
                if (prefix_size != 0) {
                  memcpy(local_48,png_ptr->read_buffer,uVar3);
                }
                local_48 = png_ptr->read_buffer;
                png_ptr->read_buffer = ppVar5;
                png_ptr->read_buffer_size = local_40;
                iVar2 = 1;
              }
            }
            png_free(png_ptr,local_48);
            if ((iVar2 == 1) && (iVar2 = 1, chunklength - prefix_size != local_4c)) {
              png_chunk_benign_error(png_ptr,"extra compressed data");
            }
          }
        }
        else {
          png_zstream_error(png_ptr,1);
          iVar2 = -7;
        }
      }
      png_ptr->zowner = 0;
    }
    else {
      iVar2 = -7;
      if (iVar1 != 1) {
        iVar2 = iVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

static int
png_decompress_chunk(png_structrp png_ptr,
    png_uint_32 chunklength, png_uint_32 prefix_size,
    png_alloc_size_t *newlength /* must be initialized to the maximum! */,
    int terminate /*add a '\0' to the end of the uncompressed data*/)
{
   /* TODO: implement different limits for different types of chunk.
    *
    * The caller supplies *newlength set to the maximum length of the
    * uncompressed data, but this routine allocates space for the prefix and
    * maybe a '\0' terminator too.  We have to assume that 'prefix_size' is
    * limited only by the maximum chunk size.
    */
   png_alloc_size_t limit = PNG_SIZE_MAX;

# ifdef PNG_SET_USER_LIMITS_SUPPORTED
   if (png_ptr->user_chunk_malloc_max > 0 &&
       png_ptr->user_chunk_malloc_max < limit)
      limit = png_ptr->user_chunk_malloc_max;
# elif PNG_USER_CHUNK_MALLOC_MAX > 0
   if (PNG_USER_CHUNK_MALLOC_MAX < limit)
      limit = PNG_USER_CHUNK_MALLOC_MAX;
# endif

   if (limit >= prefix_size + (terminate != 0))
   {
      int ret;

      limit -= prefix_size + (terminate != 0);

      if (limit < *newlength)
         *newlength = limit;

      /* Now try to claim the stream. */
      ret = png_inflate_claim(png_ptr, png_ptr->chunk_name);

      if (ret == Z_OK)
      {
         png_uint_32 lzsize = chunklength - prefix_size;

         ret = png_inflate(png_ptr, png_ptr->chunk_name, 1/*finish*/,
             /* input: */ png_ptr->read_buffer + prefix_size, &lzsize,
             /* output: */ NULL, newlength);

         if (ret == Z_STREAM_END)
         {
            /* Use 'inflateReset' here, not 'inflateReset2' because this
             * preserves the previously decided window size (otherwise it would
             * be necessary to store the previous window size.)  In practice
             * this doesn't matter anyway, because png_inflate will call inflate
             * with Z_FINISH in almost all cases, so the window will not be
             * maintained.
             */
            if (inflateReset(&png_ptr->zstream) == Z_OK)
            {
               /* Because of the limit checks above we know that the new,
                * expanded, size will fit in a size_t (let alone an
                * png_alloc_size_t).  Use png_malloc_base here to avoid an
                * extra OOM message.
                */
               png_alloc_size_t new_size = *newlength;
               png_alloc_size_t buffer_size = prefix_size + new_size +
                   (terminate != 0);
               png_bytep text = png_voidcast(png_bytep, png_malloc_base(png_ptr,
                   buffer_size));

               if (text != NULL)
               {
                  memset(text, 0, buffer_size);

                  ret = png_inflate(png_ptr, png_ptr->chunk_name, 1/*finish*/,
                      png_ptr->read_buffer + prefix_size, &lzsize,
                      text + prefix_size, newlength);

                  if (ret == Z_STREAM_END)
                  {
                     if (new_size == *newlength)
                     {
                        if (terminate != 0)
                           text[prefix_size + *newlength] = 0;

                        if (prefix_size > 0)
                           memcpy(text, png_ptr->read_buffer, prefix_size);

                        {
                           png_bytep old_ptr = png_ptr->read_buffer;

                           png_ptr->read_buffer = text;
                           png_ptr->read_buffer_size = buffer_size;
                           text = old_ptr; /* freed below */
                        }
                     }

                     else
                     {
                        /* The size changed on the second read, there can be no
                         * guarantee that anything is correct at this point.
                         * The 'msg' pointer has been set to "unexpected end of
                         * LZ stream", which is fine, but return an error code
                         * that the caller won't accept.
                         */
                        ret = PNG_UNEXPECTED_ZLIB_RETURN;
                     }
                  }

                  else if (ret == Z_OK)
                     ret = PNG_UNEXPECTED_ZLIB_RETURN; /* for safety */

                  /* Free the text pointer (this is the old read_buffer on
                   * success)
                   */
                  png_free(png_ptr, text);

                  /* This really is very benign, but it's still an error because
                   * the extra space may otherwise be used as a Trojan Horse.
                   */
                  if (ret == Z_STREAM_END &&
                      chunklength - prefix_size != lzsize)
                     png_chunk_benign_error(png_ptr, "extra compressed data");
               }

               else
               {
                  /* Out of memory allocating the buffer */
                  ret = Z_MEM_ERROR;
                  png_zstream_error(png_ptr, Z_MEM_ERROR);
               }
            }

            else
            {
               /* inflateReset failed, store the error message */
               png_zstream_error(png_ptr, ret);
               ret = PNG_UNEXPECTED_ZLIB_RETURN;
            }
         }

         else if (ret == Z_OK)
            ret = PNG_UNEXPECTED_ZLIB_RETURN;

         /* Release the claimed stream */
         png_ptr->zowner = 0;
      }

      else /* the claim failed */ if (ret == Z_STREAM_END) /* impossible! */
         ret = PNG_UNEXPECTED_ZLIB_RETURN;

      return ret;
   }

   else
   {
      /* Application/configuration limits exceeded */
      png_zstream_error(png_ptr, Z_MEM_ERROR);
      return Z_MEM_ERROR;
   }
}